

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

void libyuv::ScaleUVBilinearUp
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_uv,uint8_t *dst_uv,int x,int dx,int y,int dy,
               FilterMode filtering)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int yf;
  int lasty;
  int rowstride;
  uint8_t *rowptr;
  uint8_t *row;
  uint8_t *row_mem;
  int kRowSize;
  uint8_t *src;
  int yi;
  int max_y;
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int *ScaleUVFilterCols;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int j;
  undefined8 in_stack_ffffffffffffff80;
  int test_flag;
  code *local_78;
  int local_68;
  uint local_64;
  ulong local_60;
  long local_40;
  int local_38;
  code *local_30;
  code *local_28;
  int local_1c;
  
  local_28 = InterpolateRow_C;
  if ((int)row_mem == 0) {
    local_78 = ScaleUVCols_C;
  }
  else {
    local_78 = ScaleUVFilterCols_C;
  }
  local_30 = local_78;
  iVar1 = (in_ESI + -1) * 0x10000;
  test_flag = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  iVar2 = TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (local_28 = InterpolateRow_Any_SSSE3, (in_EDX & 3) == 0)) {
    local_28 = InterpolateRow_SSSE3;
  }
  iVar2 = TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (local_28 = InterpolateRow_Any_AVX2, (in_EDX & 7) == 0)) {
    local_28 = InterpolateRow_AVX2;
  }
  if (0x7fff < in_EDI) {
    if ((int)row_mem == 0) {
      local_30 = ScaleUVCols64_C;
    }
    else {
      local_30 = ScaleUVFilterCols64_C;
    }
  }
  if ((((int)row_mem == 0) && (in_EDI << 1 == in_EDX)) && (in_stack_00000018 < 0x8000)) {
    local_30 = ScaleUVColsUp2_C;
  }
  if (iVar1 < (int)rowptr) {
    rowptr._0_4_ = iVar1;
  }
  local_68 = (int)rowptr >> 0x10;
  local_40 = in_stack_00000008 + local_68 * in_R8D;
  local_64 = in_EDX * 2 + 0xf & 0xfffffff0;
  __ptr = malloc((long)(int)(local_64 * 2 + 0x3f));
  local_60 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
  (*local_30)(local_60,local_40,in_EDX,in_stack_00000018,lasty);
  if (1 < in_ESI) {
    local_40 = local_40 + in_R8D;
  }
  (*local_30)(local_60 + (long)(int)local_64,local_40,in_EDX,in_stack_00000018,lasty);
  local_40 = local_40 + in_R8D;
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    local_38 = (int)rowptr >> 0x10;
    if (local_38 != local_68) {
      if (iVar1 < (int)rowptr) {
        local_38 = iVar1 >> 0x10;
        local_40 = in_stack_00000008 + local_38 * in_R8D;
        rowptr._0_4_ = iVar1;
      }
      if (local_38 != local_68) {
        (*local_30)(local_60,local_40,in_EDX,in_stack_00000018,lasty);
        local_60 = local_60 + (long)(int)local_64;
        local_64 = -local_64;
        local_68 = local_38;
        local_40 = local_40 + in_R8D;
      }
    }
    if ((int)row_mem == 1) {
      (*local_28)(in_stack_00000010,local_60,0,in_EDX << 1,0);
    }
    else {
      (*local_28)(in_stack_00000010,local_60,(long)(int)local_64,in_EDX << 1,(int)rowptr >> 8 & 0xff
                 );
    }
    in_stack_00000010 = in_stack_00000010 + in_R9D;
    rowptr._0_4_ = (int)row + (int)rowptr;
  }
  free(__ptr);
  return;
}

Assistant:

static void ScaleUVBilinearUp(int src_width,
                              int src_height,
                              int dst_width,
                              int dst_height,
                              int src_stride,
                              int dst_stride,
                              const uint8_t* src_uv,
                              uint8_t* dst_uv,
                              int x,
                              int dx,
                              int y,
                              int dy,
                              enum FilterMode filtering) {
  int j;
  void (*InterpolateRow)(uint8_t * dst_uv, const uint8_t* src_uv,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  void (*ScaleUVFilterCols)(uint8_t * dst_uv, const uint8_t* src_uv,
                            int dst_width, int x, int dx) =
      filtering ? ScaleUVFilterCols_C : ScaleUVCols_C;
  const int max_y = (src_height - 1) << 16;
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 4)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width, 8)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width, 4)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(dst_width, 2)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(dst_width, 8)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif
  if (src_width >= 32768) {
    ScaleUVFilterCols = filtering ? ScaleUVFilterCols64_C : ScaleUVCols64_C;
  }
#if defined(HAS_SCALEUVFILTERCOLS_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleUVFilterCols = ScaleUVFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEUVFILTERCOLS_NEON)
  if (filtering && TestCpuFlag(kCpuHasNEON)) {
    ScaleUVFilterCols = ScaleUVFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVFilterCols = ScaleUVFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEUVFILTERCOLS_MSA)
  if (filtering && TestCpuFlag(kCpuHasMSA)) {
    ScaleUVFilterCols = ScaleUVFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVFilterCols = ScaleUVFilterCols_MSA;
    }
  }
#endif
#if defined(HAS_SCALEUVCOLS_SSSE3)
  if (!filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleUVFilterCols = ScaleUVCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEUVCOLS_NEON)
  if (!filtering && TestCpuFlag(kCpuHasNEON)) {
    ScaleUVFilterCols = ScaleUVCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVFilterCols = ScaleUVCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEUVCOLS_MMI)
  if (!filtering && TestCpuFlag(kCpuHasMMI)) {
    ScaleUVFilterCols = ScaleUVCols_Any_MMI;
    if (IS_ALIGNED(dst_width, 1)) {
      ScaleUVFilterCols = ScaleUVCols_MMI;
    }
  }
#endif
#if defined(HAS_SCALEUVCOLS_MSA)
  if (!filtering && TestCpuFlag(kCpuHasMSA)) {
    ScaleUVFilterCols = ScaleUVCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVFilterCols = ScaleUVCols_MSA;
    }
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleUVFilterCols = ScaleUVColsUp2_C;
#if defined(HAS_SCALEUVCOLSUP2_SSSE3)
    if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(dst_width, 8)) {
      ScaleUVFilterCols = ScaleUVColsUp2_SSSE3;
    }
#endif
#if defined(HAS_SCALEUVCOLSUP2_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 4)) {
      ScaleUVFilterCols = ScaleUVColsUp2_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }

  {
    int yi = y >> 16;
    const uint8_t* src = src_uv + yi * src_stride;

    // Allocate 2 rows of UV.
    const int kRowSize = (dst_width * 2 + 15) & ~15;
    align_buffer_64(row, kRowSize * 2);

    uint8_t* rowptr = row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleUVFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleUVFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_uv + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleUVFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_uv, rowptr, 0, dst_width * 2, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_uv, rowptr, rowstride, dst_width * 2, yf);
      }
      dst_uv += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}